

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_MakePI(int NP,char *str)

{
  int local_1c;
  int i;
  char *str_local;
  int NP_local;
  
  local_1c = 0;
  str_local._4_4_ = NP;
  while( true ) {
    if (4 < local_1c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                    ,0x30a,"void Dtt_MakePI(int, char *)");
    }
    if ((str_local._4_4_ & 7) == 0) break;
    str_local._4_4_ = (int)str_local._4_4_ >> 4;
    local_1c = local_1c + 1;
  }
  if ((str_local._4_4_ & 8) == 0) {
    sprintf(str,"%c",(ulong)(local_1c + 0x61));
  }
  else {
    sprintf(str,"~%c",(ulong)(local_1c + 0x61));
  }
  return;
}

Assistant:

void Dtt_MakePI( int NP, char* str )
{
    // apply P'[i], find the i s.t. P'[i]==0, correspond to N'[i]
    int i;
    for ( i = 0; i < 5; i++ )
    {
        if ( ( NP & 0x7 ) == 0 )
        {
            if ( NP & 0x8 ) 
                sprintf( str, "~%c", 'a'+i );
            else
                sprintf( str, "%c", 'a'+i );
            return;
        }
        NP = NP >> 4;
    }
    assert(0);
}